

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

void adl_setHVibrato(ADL_MIDIPlayer *device,int hvibro)

{
  void *pvVar1;
  OPL3 *this;
  bool bVar2;
  byte bVar3;
  
  if (device != (ADL_MIDIPlayer *)0x0) {
    pvVar1 = device->adl_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x1ec,"void adl_setHVibrato(ADL_MIDIPlayer *, int)");
    }
    this = *(OPL3 **)((long)pvVar1 + 0x198);
    *(int *)((long)pvVar1 + 0x11b8) = hvibro;
    bVar2 = OPL3::setupLocked(this);
    if (!bVar2) {
      bVar3 = *(int *)((long)pvVar1 + 0x11b8) != 0;
      if (*(int *)((long)pvVar1 + 0x11b8) < 0) {
        bVar3 = (this->m_insBankSetup).deepVibrato;
      }
      this->m_deepVibratoMode = (bool)(bVar3 & 1);
      OPL3::commitDeepFlags(this);
      return;
    }
  }
  return;
}

Assistant:

ADLMIDI_EXPORT void adl_setHVibrato(ADL_MIDIPlayer *device, int hvibro)
{
    if(!device) return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth &synth = *play->m_synth;
    play->m_setup.deepVibratoMode = hvibro;
    if(!synth.setupLocked())
    {
        synth.m_deepVibratoMode     = play->m_setup.deepVibratoMode < 0 ?
                                        synth.m_insBankSetup.deepVibrato :
                                        (play->m_setup.deepVibratoMode != 0);
        synth.commitDeepFlags();
    }
}